

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O3

string * __thiscall
phosg::format_data_abi_cxx11_
          (string *__return_storage_ptr__,phosg *this,vector<iovec,_std::allocator<iovec>_> *iovs,
          uint64_t start_address,vector<iovec,_std::allocator<iovec>_> *prev_iovs,uint64_t flags)

{
  uint64_t start_address_00;
  iovec *prev_iovs_00;
  uint64_t in_stack_fffffffffffffff0;
  
  if (start_address == 0) {
    start_address_00 = 0;
    prev_iovs_00 = (iovec *)0x0;
  }
  else {
    start_address_00 = *(uint64_t *)start_address;
    prev_iovs_00 = (iovec *)((long)(*(long *)(start_address + 8) - start_address_00) >> 4);
  }
  format_data_abi_cxx11_
            (__return_storage_ptr__,*(phosg **)this,
             (iovec *)(*(long *)(this + 8) - (long)*(phosg **)this >> 4),(size_t)iovs,
             start_address_00,prev_iovs_00,(size_t)prev_iovs,in_stack_fffffffffffffff0);
  return __return_storage_ptr__;
}

Assistant:

string format_data(
    const vector<struct iovec>& iovs,
    uint64_t start_address,
    const vector<struct iovec>* prev_iovs,
    uint64_t flags) {
  if (prev_iovs) {
    return format_data(iovs.data(), iovs.size(), start_address, prev_iovs->data(), prev_iovs->size(), flags);
  } else {
    return format_data(iovs.data(), iovs.size(), start_address, nullptr, 0, flags);
  }
}